

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ExecutionModel stage_to_execution_model(string *stage)

{
  int iVar1;
  ExecutionModel EVar2;
  runtime_error *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = std::__cxx11::string::compare((char *)stage);
  if (iVar1 == 0) {
    EVar2 = ExecutionModelVertex;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)stage);
    if (iVar1 == 0) {
      EVar2 = ExecutionModelFragment;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)stage);
      if (iVar1 == 0) {
        EVar2 = ExecutionModelGLCompute;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)stage);
        if (iVar1 == 0) {
          EVar2 = ExecutionModelTessellationControl;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)stage);
          if (iVar1 == 0) {
            EVar2 = ExecutionModelTessellationEvaluation;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)stage);
            EVar2 = ExecutionModelGeometry;
            if (iVar1 != 0) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              local_40[0] = local_30;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_40,"Invalid stage.","");
              std::runtime_error::runtime_error(this,(string *)local_40);
              *(undefined ***)this = &PTR__runtime_error_0035b0b8;
              __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                          std::runtime_error::~runtime_error);
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

static ExecutionModel stage_to_execution_model(const std::string &stage)
{
	if (stage == "vert")
		return ExecutionModelVertex;
	else if (stage == "frag")
		return ExecutionModelFragment;
	else if (stage == "comp")
		return ExecutionModelGLCompute;
	else if (stage == "tesc")
		return ExecutionModelTessellationControl;
	else if (stage == "tese")
		return ExecutionModelTessellationEvaluation;
	else if (stage == "geom")
		return ExecutionModelGeometry;
	else
		SPIRV_CROSS_THROW("Invalid stage.");
}